

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

CF2_F16Dot16 cf2_hintmap_map(CF2_HintMap hintmap,CF2_F16Dot16 csCoord)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  CF2_F16Dot16 *pCVar8;
  
  if ((hintmap->count == 0) || (hintmap->hinted == '\0')) {
    lVar6 = (long)csCoord * (long)hintmap->scale;
    return (CF2_F16Dot16)((ulong)((lVar6 >> 0x3f) + lVar6 + 0x8000) >> 0x10);
  }
  uVar5 = hintmap->lastIndex;
  uVar7 = (ulong)uVar5;
  uVar4 = hintmap->count - 1;
  uVar2 = uVar4;
  if (uVar4 < uVar5) {
    uVar2 = uVar5;
  }
  uVar5 = uVar5 - 1;
  pCVar8 = &hintmap->edge[uVar7 + 1].csCoord;
  do {
    uVar3 = uVar2;
    if (uVar4 <= uVar7) break;
    uVar7 = uVar7 + 1;
    uVar5 = uVar5 + 1;
    iVar1 = *pCVar8;
    pCVar8 = pCVar8 + 8;
    uVar3 = uVar5;
  } while (iVar1 <= csCoord);
  do {
    uVar5 = uVar3;
    if (uVar5 == 0) {
      hintmap->lastIndex = 0;
      iVar1 = hintmap->edge[0].csCoord;
      if (csCoord < iVar1) {
        lVar6 = (long)(csCoord - iVar1) * (long)hintmap->scale;
        return (int)((ulong)(lVar6 + (lVar6 >> 0x3f) + 0x8000) >> 0x10) + hintmap->edge[0].dsCoord;
      }
      uVar7 = 0;
      goto LAB_00151ec1;
    }
    uVar7 = (ulong)uVar5;
    uVar3 = uVar5 - 1;
  } while (csCoord < hintmap->edge[uVar7].csCoord);
  hintmap->lastIndex = uVar5;
LAB_00151ec1:
  lVar6 = (long)(csCoord - hintmap->edge[uVar7].csCoord) * (long)hintmap->edge[uVar7].scale;
  return (int)((ulong)((lVar6 >> 0x3f) + lVar6 + 0x8000) >> 0x10) + hintmap->edge[uVar7].dsCoord;
}

Assistant:

static CF2_Fixed
  cf2_hintmap_map( CF2_HintMap  hintmap,
                   CF2_Fixed    csCoord )
  {
    if ( hintmap->count == 0 || ! hintmap->hinted )
    {
      /* there are no hints; use uniform scale and zero offset */
      return FT_MulFix( csCoord, hintmap->scale );
    }
    else
    {
      /* start linear search from last hit */
      CF2_UInt  i = hintmap->lastIndex;


      FT_ASSERT( hintmap->lastIndex < CF2_MAX_HINT_EDGES );

      /* search up */
      while ( i < hintmap->count - 1                  &&
              csCoord >= hintmap->edge[i + 1].csCoord )
        i += 1;

      /* search down */
      while ( i > 0 && csCoord < hintmap->edge[i].csCoord )
        i -= 1;

      hintmap->lastIndex = i;

      if ( i == 0 && csCoord < hintmap->edge[0].csCoord )
      {
        /* special case for points below first edge: use uniform scale */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[0].csCoord ),
                                     hintmap->scale ),
                          hintmap->edge[0].dsCoord );
      }
      else
      {
        /*
         * Note: entries with duplicate csCoord are allowed.
         * Use edge[i], the highest entry where csCoord >= entry[i].csCoord
         */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[i].csCoord ),
                                     hintmap->edge[i].scale ),
                          hintmap->edge[i].dsCoord );
      }
    }
  }